

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void * ma_calloc(size_t sz,ma_allocation_callbacks *pAllocationCallbacks)

{
  void *__s;
  size_t in_RDI;
  void *p;
  size_t in_stack_ffffffffffffffd8;
  
  __s = ma_malloc(in_stack_ffffffffffffffd8,(ma_allocation_callbacks *)0x230dad);
  if (((__s != (void *)0x0) && (__s != (void *)0x0)) && (in_RDI != 0)) {
    memset(__s,0,in_RDI);
  }
  return __s;
}

Assistant:

MA_API void* ma_calloc(size_t sz, const ma_allocation_callbacks* pAllocationCallbacks)
{
    void* p = ma_malloc(sz, pAllocationCallbacks);
    if (p != NULL) {
        MA_ZERO_MEMORY(p, sz);
    }

    return p;
}